

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O2

uint64_t kratos::hash_generator(Generator *generator)

{
  bool bVar1;
  uint64_t uVar2;
  undefined1 local_a0 [8];
  HashVisitor hash_visitor;
  
  bVar1 = Context::is_unique(generator->context_,generator);
  if (bVar1) {
    uVar2 = hash_64_fnv1a((generator->name)._M_dataplus._M_p,(generator->name)._M_string_length);
    return uVar2;
  }
  HashVisitor::HashVisitor((HashVisitor *)local_a0,generator);
  IRVisitor::visit_root((IRVisitor *)local_a0,&generator->super_IRNode);
  uVar2 = HashVisitor::produce_hash((HashVisitor *)local_a0);
  HashVisitor::~HashVisitor((HashVisitor *)local_a0);
  return uVar2;
}

Assistant:

uint64_t hash_generator(Generator* generator) {
    // if it's unique, just has the name
    if (generator->context()->is_unique(generator)) {
        return hash_64_fnv1a(generator->name.c_str(), generator->name.size());
    }
    // we use a visitor to compute all the hashes
    HashVisitor hash_visitor(generator);
    hash_visitor.visit_root(generator);
    return hash_visitor.produce_hash();
}